

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Data
          (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this,
          Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *other)

{
  long lVar1;
  undefined4 uVar2;
  bool bVar3;
  Node<int,_QSocketNotifierSetUNIX> *pNVar4;
  Node<int,_QSocketNotifierSetUNIX> *pNVar5;
  long in_RSI;
  Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *in_RDI;
  long in_FS_OFFSET;
  R_conflict7 RVar6;
  Node<int,_QSocketNotifierSetUNIX> *newNode;
  Node<int,_QSocketNotifierSetUNIX> *n;
  size_t index;
  Span *span;
  size_t s;
  R_conflict7 r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI->offsets + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  *(undefined8 *)(in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  RVar6 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar6.spans;
  *(Span **)(in_RDI->offsets + 0x20) = local_28;
  local_20 = RVar6.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar3 = Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::hasNode
                        ((Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)
                         (lVar1 + local_48 * 0x90),local_58);
      if (bVar3) {
        pNVar4 = Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::at(this_00,(size_t)in_RDI);
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        pNVar5 = Bucket::insert((Bucket *)0x6beb6b);
        uVar2 = *(undefined4 *)&pNVar4->field_0x4;
        pNVar5->key = pNVar4->key;
        *(undefined4 *)&pNVar5->field_0x4 = uVar2;
        (pNVar5->value).notifiers[0] = (pNVar4->value).notifiers[0];
        (pNVar5->value).notifiers[1] = (pNVar4->value).notifiers[1];
        (pNVar5->value).notifiers[2] = (pNVar4->value).notifiers[2];
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }